

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O2

void idx2::DecompressBufZstd(buffer *Input,buffer *Output)

{
  unsigned_long_long dstCapacity;
  size_t sVar1;
  
  dstCapacity = ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  sVar1 = ZSTD_decompress(Output->Data,dstCapacity,Input->Data,Input->Bytes);
  if (sVar1 == dstCapacity) {
    return;
  }
  fwrite("Zstd decompression failed\n",0x1a,1,_stderr);
  exit(1);
}

Assistant:

void
DecompressBufZstd(const buffer& Input, buffer* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  idx2_Assert(Size(*Output) >= (i64)OutputSize);
  size_t const Result = ZSTD_decompress(Output->Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}